

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnicode.c
# Opt level: O3

JL_STATUS JlUnicodeCharFromUtf8
                    (char *Utf8String,size_t Utf8StringLength,uint32_t *pUnicodeValue,
                    size_t *pNumBytesUsed)

{
  byte bVar1;
  JL_STATUS JVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  byte bVar6;
  
  bVar1 = *Utf8String;
  uVar4 = (uint)bVar1;
  if ((uVar4 & 0xfffffff8) == 0xf0) {
    sVar5 = 4;
    bVar6 = 7;
  }
  else if ((bVar1 & 0xf0) == 0xe0) {
    sVar5 = 3;
    bVar6 = 0xf;
  }
  else {
    if ((uVar4 & 0xffffffe0) != 0xc0) {
      if (Utf8StringLength == 0 || (char)bVar1 < '\0') {
        return JL_STATUS_INVALID_DATA;
      }
      sVar5 = 1;
      goto LAB_0011d678;
    }
    sVar5 = 2;
    bVar6 = 0x1f;
  }
  if (Utf8StringLength < sVar5) {
    return JL_STATUS_INVALID_DATA;
  }
  uVar4 = (uint)(bVar1 & bVar6);
  lVar3 = 1;
  do {
    if (((byte)Utf8String[lVar3] & 0xffffffc0) != 0x80) {
      return JL_STATUS_INVALID_DATA;
    }
    uVar4 = (byte)Utf8String[lVar3] & 0x3f | uVar4 << 6;
    lVar3 = lVar3 + 1;
  } while ((uint)lVar3 < (uint)sVar5);
LAB_0011d678:
  JVar2 = JL_STATUS_INVALID_DATA;
  if (uVar4 - 0xe000 < 0xfffff800 && uVar4 < 0x110000) {
    *pUnicodeValue = uVar4;
    *pNumBytesUsed = sVar5;
    JVar2 = JL_STATUS_SUCCESS;
  }
  return JVar2;
}

Assistant:

JL_STATUS
    JlUnicodeCharFromUtf8
    (
        char const*     Utf8String,
        size_t          Utf8StringLength,
        uint32_t*       pUnicodeValue,
        size_t*         pNumBytesUsed
    )
{
    // Determine number of bytes needed.
    // We assume Utf8StringLength is at least 1 byte long.
    size_t numBytesNeeded = 0;
    uint8_t topBits = 0;
    JL_STATUS jlStatus;

    if( 0xf0 == (Utf8String[0] & 0xf8) )
    {
        numBytesNeeded = 4;
        topBits = Utf8String[0] & 0x07;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xe0 == (Utf8String[0] & 0xf0) )
    {
        numBytesNeeded = 3;
        topBits = Utf8String[0] & 0x0f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0xc0 == (Utf8String[0] & 0xe0) )
    {
        numBytesNeeded = 2;
        topBits = Utf8String[0] & 0x1f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else if( 0x00 == (Utf8String[0] & 0x80) )
    {
        numBytesNeeded = 1;
        topBits = Utf8String[0] & 0x7f;
        jlStatus = JL_STATUS_SUCCESS;
    }
    else
    {
        // Is either a continuation character without a start, or an invalid start such as
        // a 5 or 6 byte character which is not valid in UTF8
        jlStatus = JL_STATUS_INVALID_DATA;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        if( numBytesNeeded <= Utf8StringLength )
        {
            // Start with the top bits
            uint32_t unicode = topBits;

            /// Now slide in the next bits in sets of 6 for each continuation character
            for( uint32_t i=1; i<numBytesNeeded; i++ )
            {
                // Verify that this is a continuation utf8 char
                if( 0x80 == (Utf8String[i] & 0xc0) )
                {
                    unicode <<= 6;
                    unicode |= (Utf8String[i] & 0x3f );
                }
                else
                {
                    // Not a continuation character. This is invalid UTF8
                    jlStatus = JL_STATUS_INVALID_DATA;
                    break;
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if(     unicode <= 0x10ffff
                    &&  (unicode < 0xd800 || unicode > 0xdfff) )
                {
                    // Valid unicode range (We don't allow UTF16 surrogate pairs to appear in the utf8)
                    *pUnicodeValue = unicode;
                    *pNumBytesUsed = numBytesNeeded;
                }
                else
                {
                    jlStatus = JL_STATUS_INVALID_DATA;
                }
            }
        }
        else
        {
            // Not enough bytes to complete utf8 character
            jlStatus = JL_STATUS_INVALID_DATA;
        }
    }

    return jlStatus;
}